

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O2

void __thiscall
iu_PrintToTest_x_iutest_x_U32String_Test::iu_PrintToTest_x_iutest_x_U32String_Test
          (iu_PrintToTest_x_iutest_x_U32String_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00160938;
  return;
}

Assistant:

IUTEST(PrintToTest, U32String)
{
#if IUTEST_HAS_CHAR32_T_PRINTABLE
    {
        LogChecker ck("XYZ");
        IUTEST_PRINTTOSTRING_EQ(ck, U"XYZ");
        IUTEST_STREAMOUT_CHECK(U"XYZ");
    }
    {
        LogChecker ck("\'A\'");
        char32_t c = U'A';
        IUTEST_PRINTTOSTRING_EQ(ck, c);
        IUTEST_STREAMOUT_CHECK(c);
    }
#endif
    {
        LogChecker ck("\\0");
        char32_t c = 0;
        IUTEST_PRINTTOSTRING_EQ(ck, c);
        IUTEST_STREAMOUT_CHECK(c);
    }
    {
        LogChecker ck("(null)");
        char32_t* p = NULL;
        IUTEST_PRINTTOSTRING_EQ(ck, p);
        IUTEST_STREAMOUT_CHECK(p);
    }
}